

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  pointer ppVar1;
  pointer ppBVar2;
  bool bVar3;
  ConstructType CVar4;
  uint uVar5;
  spv_result_t sVar6;
  __hashtable *__h;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar7;
  mapped_type *pmVar8;
  BasicBlock *pBVar9;
  BasicBlock *this;
  BasicBlock *pBVar10;
  const_iterator cVar11;
  undefined8 uVar12;
  Instruction *pIVar13;
  long *plVar14;
  undefined8 *puVar15;
  pointer ppVar16;
  Instruction **ppIVar17;
  BasicBlock **ppBVar18;
  ConstructType type;
  ConstructType type_00;
  char *pcVar19;
  pointer ppBVar20;
  uint32_t merge_block_id;
  char *pcVar21;
  long lVar22;
  undefined1 auVar23 [8];
  pair<spvtools::val::BasicBlock_*,_bool> pVar24;
  uint32_t loop_header_id;
  uint32_t back_edge_block;
  uint32_t header_block;
  BasicBlock *pred;
  BasicBlock *succ;
  ConstructBlockSet construct_blocks;
  BasicBlock *merge_block;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  spv_result_t local_404;
  undefined1 local_3f0 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [32];
  undefined1 local_390 [32];
  undefined1 local_370 [32];
  Function *local_350;
  undefined1 local_348 [32];
  undefined1 local_328 [8];
  pointer local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  BasicBlock *local_2f8;
  long local_2f0;
  pointer local_2e8;
  BasicBlock *pBStack_2e0;
  BasicBlock *local_2d8;
  BasicBlock *local_2d0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_2c8;
  BasicBlock *local_2c0;
  string local_2b8;
  _Base_bitset<1UL> local_298;
  long local_290;
  Instruction *local_288;
  Instruction *pIStack_280;
  BasicBlock **local_278;
  pointer local_270;
  BasicBlock *local_268;
  pointer ppBStack_260;
  undefined1 local_258 [16];
  mapped_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [24];
  spv_result_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar16 = (back_edges->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_350 = function;
  local_2d8 = (BasicBlock *)postorder;
  local_2c8 = back_edges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar16 != ppVar1) {
    do {
      local_3d0._0_4_ = (*ppVar16).first;
      merge_block_id = (*ppVar16).second;
      local_3b0._0_4_ = merge_block_id;
      bVar3 = Function::IsBlockType(local_350,merge_block_id,kBlockTypeLoop);
      if (!bVar3) {
        pIVar13 = ValidationState_t::FindDef(_,local_3d0._0_4_);
        ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"Back-edges (",0xc);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_328,_,local_3d0._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_328,(long)local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258," -> ",4);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,local_3b0._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_3f0._0_8_,local_3f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,") can only be formed between a block and a loop header.",
                   0x37);
        local_404 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
        }
        goto LAB_0061001f;
      }
      local_258._0_8_ =
           std::
           map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                         *)&local_60,(key_type_conflict *)local_3b0);
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_258._0_8_,
                 (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_3d0,local_258);
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar1);
  }
  pvVar7 = Function::ordered_blocks(local_350);
  ppBVar20 = (pvVar7->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (pvVar7->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar20 != ppBVar2) {
LAB_0060f458:
    pBVar10 = *ppBVar20;
    if ((pBVar10->structurally_reachable_ != true) ||
       (((pBVar10->type_).super__Base_bitset<1UL>._M_w & 4) == 0)) goto LAB_0060f486;
    local_3f0._0_4_ = pBVar10->id_;
    pmVar8 = std::
             map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&local_60,(key_type_conflict *)local_3f0);
    if ((pmVar8->_M_h)._M_element_count == 1) goto LAB_0060f486;
    pIVar13 = ValidationState_t::FindDef(_,local_3f0._0_4_);
    ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"Loop header ",0xc);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_328,_,local_3f0._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258,(char *)local_328,(long)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258," is targeted by ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258," back-edge blocks but the standard requires exactly one",0x37);
    local_404 = local_88;
LAB_0061001f:
    if (local_328 != (undefined1  [8])local_318) {
      lVar22 = CONCAT71(local_318[0]._M_allocated_capacity._1_7_,local_318[0]._M_local_buf[0]);
      auVar23 = local_328;
      goto LAB_00610337;
    }
    goto LAB_0061033f;
  }
LAB_0060f48f:
  pBVar9 = (BasicBlock *)Function::constructs_abi_cxx11_(local_350);
  pBVar10 = *(BasicBlock **)pBVar9;
  if (pBVar10 != pBVar9) {
    local_2d0 = pBVar9;
    do {
      ppBVar18 = &pBVar10->immediate_structural_dominator_;
      this = Construct::entry_block((Construct *)ppBVar18);
      if (this->structurally_reachable_ == true) {
        local_2c0 = pBVar10;
        pBVar10 = Construct::exit_block((Construct *)ppBVar18);
        if (pBVar10 != (BasicBlock *)0x0) {
          bVar3 = BasicBlock::structurally_dominates(this,pBVar10);
          if (bVar3) {
            if ((this == pBVar10) && (((ulong)*ppBVar18 & 0xfffffffd) == 1)) {
              pIVar13 = ValidationState_t::FindDef(_,pBVar10->id_);
              ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13)
              ;
              ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,this->id_);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_3d0,_,pBVar10->id_);
              pcVar21 = "does not strictly structurally dominate";
              pcVar19 = "";
              goto LAB_0061028b;
            }
            CVar4 = Construct::type((Construct *)ppBVar18);
            if ((CVar4 != kContinue) ||
               (bVar3 = BasicBlock::structurally_postdominates(pBVar10,this), bVar3)) {
              Construct::blocks((ConstructBlockSet *)local_328,(Construct *)ppBVar18,local_350);
              local_3f0._8_8_ = (BasicBlock *)0x0;
              local_3f0[0x10] = '\0';
              local_3d0._8_8_ = (pointer)0x0;
              local_3c0[0] = '\0';
              local_3b0._0_8_ = local_3b0 + 0x10;
              local_3b0._8_8_ = (BasicBlock *)0x0;
              local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
              local_3f0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_3f0 + 0x10);
              local_3d0._0_8_ = (BasicBlock *)(local_3d0 + 0x10);
              CVar4 = Construct::type((Construct *)ppBVar18);
              ConstructNames_abi_cxx11_
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_258,(val *)(ulong)CVar4,type);
              local_390._0_8_ = local_3b0;
              local_390._8_8_ = local_3d0;
              local_390._16_8_ = local_3f0;
              std::
              _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
              _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          *)local_390,
                         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_h._M_single_bucket != local_208) {
                operator_delete(local_248._M_h._M_single_bucket,
                                local_208[0]._M_allocated_capacity + 1);
              }
              if ((_Prime_rehash_policy *)local_248._M_h._M_before_begin._M_nxt !=
                  &local_248._M_h._M_rehash_policy) {
                operator_delete(local_248._M_h._M_before_begin._M_nxt,
                                local_248._M_h._M_rehash_policy._0_8_ + 1);
              }
              uVar12 = local_318[0]._8_8_;
              if ((mapped_type *)local_258._0_8_ != &local_248) {
                operator_delete((void *)local_258._0_8_,(long)local_248._M_h._M_buckets + 1);
                uVar12 = local_318[0]._8_8_;
              }
              for (; (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&local_320;
                  uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
                pBVar10 = *(BasicBlock **)(uVar12 + 0x20);
                ppBVar2 = (pBVar10->successors_).
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppBVar20 = (pBVar10->successors_).
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppBVar20 != ppBVar2;
                    ppBVar20 = ppBVar20 + 1) {
                  local_370._0_8_ = *ppBVar20;
                  cVar11 = std::
                           _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                           ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   *)local_328,(key_type *)local_370);
                  if ((cVar11._M_node == (_Rb_tree_node_base *)&local_320) &&
                     (bVar3 = Construct::IsStructuredExit
                                        ((Construct *)ppBVar18,_,(BasicBlock *)local_370._0_8_),
                     !bVar3)) {
                    pIVar13 = ValidationState_t::FindDef(_,pBVar10->id_);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"block <ID> ",0xb);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_390,_,pBVar10->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_390._0_8_,local_390._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," exits the ",0xb);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_3f0._0_8_,local_3f0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," headed by <ID> ",0x10);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_348,_,this->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_348._0_8_,local_348._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,", but not via a structured exit",0x1f);
                    local_404 = local_88;
                    if ((Instruction *)local_348._0_8_ != (Instruction *)(local_348 + 0x10)) {
                      operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
                    }
                    if ((BasicBlock *)local_390._0_8_ != (BasicBlock *)(local_390 + 0x10))
                    goto LAB_0060f9e3;
                    goto LAB_0060f9f3;
                  }
                }
                if (pBVar10 != this) {
                  ppBVar2 = (pBVar10->predecessors_).
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppBVar20 = (pBVar10->predecessors_).
                                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppBVar20 != ppBVar2;
                      ppBVar20 = ppBVar20 + 1) {
                    local_390._0_8_ = *ppBVar20;
                    if ((((BasicBlock *)local_390._0_8_)->structurally_reachable_ == true) &&
                       (cVar11 = std::
                                 _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         *)local_328,(key_type *)local_390),
                       cVar11._M_node == (_Rb_tree_node_base *)&local_320)) {
                      pIVar13 = ValidationState_t::FindDef(_,*(uint32_t *)local_390._0_8_);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"block <ID> ",0xb);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_258);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," branches to the ",0x11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_3f0._0_8_,local_3f0._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," construct, but not to the ",0x1b);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_3d0._0_8_,local_3d0._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," <ID> ",6);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_258);
                      local_404 = local_88;
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
                      bVar3 = false;
                      goto LAB_0060faff;
                    }
                  }
                  if ((((pBVar10->type_).super__Base_bitset<1UL>._M_w & 6) != 0) &&
                     ((pBVar10->terminator_[-1].inst_.opcode & 0xfffe) == 0xf6)) {
                    uVar5 = Instruction::GetOperandAs<unsigned_int>(pBVar10->terminator_ + -1,0);
                    pVar24 = Function::GetBlock(local_350,uVar5);
                    local_2f8 = pVar24.first;
                    if ((local_2f8->structurally_reachable_ == true) &&
                       (cVar11 = std::
                                 _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         *)local_328,&local_2f8),
                       cVar11._M_node == (_Rb_tree_node_base *)&local_320)) {
                      pIVar13 = ValidationState_t::FindDef(_,pBVar10->id_);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"Header block ",0xd);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_390,_,pBVar10->id_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_390._0_8_,local_390._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," is contained in the ",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_3f0._0_8_,local_3f0._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," construct headed by ",0x15);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_348,_,this->id_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_348._0_8_,local_348._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,", but its merge block ",0x16);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_370,_,uVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_370._0_8_,local_370._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," is not",7);
                      local_404 = local_88;
                      if ((BasicBlock *)local_370._0_8_ != (BasicBlock *)(local_370 + 0x10)) {
                        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                      }
                      if ((Instruction *)local_348._0_8_ == (Instruction *)(local_348 + 0x10))
                      goto LAB_0060fcd3;
                      goto LAB_0060fcc3;
                    }
                  }
                }
              }
              CVar4 = Construct::type((Construct *)ppBVar18);
              if (CVar4 == kLoop) {
                uVar5 = Instruction::GetOperandAs<unsigned_int>(this->terminator_ + -1,1);
                pIVar13 = ValidationState_t::FindDef(_,uVar5);
                if (this->id_ != uVar5) {
                  ppBVar20 = ((pIVar13[1].block_)->predecessors_).
                             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppBVar2 = ((pIVar13[1].block_)->predecessors_).
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (ppBVar20 != ppBVar2) {
LAB_0060f7df:
                    local_2f8 = *ppBVar20;
                    if (local_2f8->structurally_reachable_ != true) goto LAB_0060f84a;
                    bVar3 = false;
                    for (ppVar16 = (local_2c8->
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                        ppVar16 !=
                        (local_2c8->
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish; ppVar16 = ppVar16 + 1) {
                      if (uVar5 == (*ppVar16).second) {
                        bVar3 = (bool)(bVar3 | local_2f8->id_ == (*ppVar16).first);
                      }
                    }
                    cVar11 = std::
                             _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                             ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                     *)local_328,&local_2f8);
                    if ((cVar11._M_node != (_Rb_tree_node_base *)&local_320) || (bVar3))
                    goto LAB_0060f84a;
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,
                               local_2f8->terminator_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"Block ",6);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_390,_,local_2f8->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_390._0_8_,local_390._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," branches to the loop continue target ",0x26);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_348,_,uVar5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_348._0_8_,local_348._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,
                               ", but is not contained in the associated loop construct ",0x38);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_370,_,this->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_370._0_8_,local_370._8_8_);
                    local_404 = local_88;
                    if ((BasicBlock *)local_370._0_8_ != (BasicBlock *)(local_370 + 0x10)) {
                      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                    }
                    if ((Instruction *)local_348._0_8_ != (Instruction *)(local_348 + 0x10)) {
LAB_0060fcc3:
                      operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
                    }
LAB_0060fcd3:
                    if ((BasicBlock *)local_390._0_8_ != (BasicBlock *)(local_390 + 0x10)) {
LAB_0060f9e3:
                      operator_delete((void *)local_390._0_8_,(ulong)(local_390._16_8_ + 1));
                    }
LAB_0060f9f3:
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
                    bVar3 = false;
                    goto LAB_0060faff;
                  }
                }
              }
LAB_0060f853:
              CVar4 = Construct::type((Construct *)ppBVar18);
              bVar3 = true;
              if ((CVar4 == kSelection) && ((this->terminator_->inst_).opcode == 0xfb)) {
                sVar6 = StructuredSwitchChecks(_,local_350,(Construct *)ppBVar18);
                bVar3 = sVar6 == SPV_SUCCESS;
                if (!bVar3) {
                  local_404 = sVar6;
                }
              }
LAB_0060faff:
              if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
              }
              pBVar10 = local_2c0;
              if ((BasicBlock *)local_3d0._0_8_ != (BasicBlock *)(local_3d0 + 0x10)) {
                operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3c0._1_7_,local_3c0[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3f0 + 0x10)) {
                operator_delete((void *)local_3f0._0_8_,
                                CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
              }
              std::
              _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
              ::_M_erase((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                          *)local_328,
                         (_Link_type)
                         CONCAT71(local_318[0]._M_allocated_capacity._1_7_,
                                  local_318[0]._M_local_buf[0]));
              pBVar9 = local_2d0;
              if (bVar3) goto LAB_0060fb72;
              goto LAB_0061034c;
            }
            pIVar13 = ValidationState_t::FindDef(_,pBVar10->id_);
            ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,this->id_);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3d0,_,pBVar10->id_);
            local_3b0._0_8_ = local_3b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3b0,"is not structurally post dominated by","");
            ConstructErrorString
                      ((string *)local_328,(Construct *)ppBVar18,(string *)local_3f0,
                       (string *)local_3d0,(string *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,(char *)local_328,(long)local_320);
            local_404 = local_88;
            if (local_328 != (undefined1  [8])local_318) {
              operator_delete((void *)local_328,
                              CONCAT71(local_318[0]._M_allocated_capacity._1_7_,
                                       local_318[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
            }
            if ((BasicBlock *)local_3d0._0_8_ != (BasicBlock *)(local_3d0 + 0x10))
            goto LAB_0061031b;
          }
          else {
            pIVar13 = ValidationState_t::FindDef(_,pBVar10->id_);
            ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar13);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3f0,_,this->id_);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3d0,_,pBVar10->id_);
            pcVar21 = "does not structurally dominate";
            pcVar19 = "";
LAB_0061028b:
            local_3b0._0_8_ = local_3b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,pcVar21,pcVar19);
            ConstructErrorString
                      ((string *)local_328,(Construct *)ppBVar18,(string *)local_3f0,
                       (string *)local_3d0,(string *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,(char *)local_328,(long)local_320);
            local_404 = local_88;
            if (local_328 != (undefined1  [8])local_318) {
              operator_delete((void *)local_328,
                              CONCAT71(local_318[0]._M_allocated_capacity._1_7_,
                                       local_318[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
            }
            if ((BasicBlock *)local_3d0._0_8_ != (BasicBlock *)(local_3d0 + 0x10)) {
LAB_0061031b:
              operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3c0._1_7_,local_3c0[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3f0 + 0x10)) {
            lVar22 = CONCAT71(local_3f0._17_7_,local_3f0[0x10]);
            auVar23 = (undefined1  [8])local_3f0._0_8_;
LAB_00610337:
            operator_delete((void *)auVar23,lVar22 + 1);
          }
LAB_0061033f:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
          goto LAB_0061034c;
        }
        local_328 = (undefined1  [8])local_318;
        local_320 = (pointer)0x0;
        local_318[0]._M_local_buf[0] = '\0';
        local_3f0._8_8_ = (BasicBlock *)0x0;
        local_3f0[0x10] = '\0';
        local_3d0._8_8_ = (pointer)0x0;
        local_3c0[0] = '\0';
        local_3f0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_3f0 + 0x10);
        local_3d0._0_8_ = (BasicBlock *)(local_3d0 + 0x10);
        CVar4 = Construct::type((Construct *)ppBVar18);
        ConstructNames_abi_cxx11_
                  ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258,(val *)(ulong)CVar4,type_00);
        local_3b0._0_8_ = local_3d0;
        local_3b0._8_8_ = local_3f0;
        local_3b0._16_8_ = local_328;
        std::_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
        _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                    *)local_3b0,
                   (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_h._M_single_bucket != local_208) {
          operator_delete(local_248._M_h._M_single_bucket,local_208[0]._M_allocated_capacity + 1);
        }
        if ((_Prime_rehash_policy *)local_248._M_h._M_before_begin._M_nxt !=
            &local_248._M_h._M_rehash_policy) {
          operator_delete(local_248._M_h._M_before_begin._M_nxt,
                          local_248._M_h._M_rehash_policy._0_8_ + 1);
        }
        if ((mapped_type *)local_258._0_8_ != &local_248) {
          operator_delete((void *)local_258._0_8_,(long)local_248._M_h._M_buckets + 1);
        }
        pIVar13 = ValidationState_t::FindDef(_,this->id_);
        ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INTERNAL,pIVar13);
        std::operator+(&local_80,"Construct ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_80);
        ppIVar17 = (Instruction **)(plVar14 + 2);
        if ((Instruction **)*plVar14 == ppIVar17) {
          local_288 = *ppIVar17;
          pIStack_280 = (Instruction *)plVar14[3];
          local_298._M_w = (_WordT)&local_288;
        }
        else {
          local_288 = *ppIVar17;
          local_298._M_w = (_WordT)*plVar14;
        }
        local_290 = plVar14[1];
        *plVar14 = (long)ppIVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_298,local_3f0._0_8_);
        ppBVar18 = (BasicBlock **)(plVar14 + 2);
        if ((BasicBlock **)*plVar14 == ppBVar18) {
          local_268 = *ppBVar18;
          ppBStack_260 = (pointer)plVar14[3];
          local_278 = &local_268;
        }
        else {
          local_268 = *ppBVar18;
          local_278 = (BasicBlock **)*plVar14;
        }
        local_270 = (pointer)plVar14[1];
        *plVar14 = (long)ppBVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_278);
        pBVar10 = (BasicBlock *)(plVar14 + 2);
        if ((BasicBlock *)*plVar14 == pBVar10) {
          local_2e8 = *(pointer *)pBVar10;
          pBStack_2e0 = (BasicBlock *)plVar14[3];
          local_2f8 = (BasicBlock *)&local_2e8;
        }
        else {
          local_2e8 = *(pointer *)pBVar10;
          local_2f8 = (BasicBlock *)*plVar14;
        }
        local_2f0 = plVar14[1];
        *plVar14 = (long)pBVar10;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,this->id_);
        ppBVar20 = (pointer)0xf;
        if (local_2f8 != (BasicBlock *)&local_2e8) {
          ppBVar20 = local_2e8;
        }
        if (ppBVar20 < (pointer)(local_2b8._M_string_length + local_2f0)) {
          uVar12 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            uVar12 = local_2b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < (pointer)(local_2b8._M_string_length + local_2f0)) goto LAB_006105d8;
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_006105d8:
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_2f8,(ulong)local_2b8._M_dataplus._M_p);
        }
        local_370._0_8_ = local_370 + 0x10;
        pBVar10 = (BasicBlock *)(plVar14 + 2);
        if ((BasicBlock *)*plVar14 == pBVar10) {
          local_370._16_8_ = *(undefined8 *)pBVar10;
          local_370._24_8_ = plVar14[3];
        }
        else {
          local_370._16_8_ = *(undefined8 *)pBVar10;
          local_370._0_8_ = (BasicBlock *)*plVar14;
        }
        local_370._8_8_ = plVar14[1];
        *plVar14 = (long)pBVar10;
        plVar14[1] = 0;
        *(undefined1 *)&pBVar10->id_ = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_370);
        local_348._0_8_ = local_348 + 0x10;
        pIVar13 = (Instruction *)(plVar14 + 2);
        if ((Instruction *)*plVar14 == pIVar13) {
          local_348._16_8_ =
               (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_348._24_8_ = plVar14[3];
        }
        else {
          local_348._16_8_ =
               (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_348._0_8_ = (Instruction *)*plVar14;
        }
        local_348._8_8_ = plVar14[1];
        *plVar14 = (long)pIVar13;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_348,local_3d0._0_8_);
        local_390._0_8_ = local_390 + 0x10;
        pBVar10 = (BasicBlock *)(puVar15 + 2);
        if ((BasicBlock *)*puVar15 == pBVar10) {
          local_390._16_8_ = *(undefined8 *)pBVar10;
          local_390._24_8_ = puVar15[3];
        }
        else {
          local_390._16_8_ = *(undefined8 *)pBVar10;
          local_390._0_8_ = (BasicBlock *)*puVar15;
        }
        local_390._8_8_ = puVar15[1];
        *puVar15 = pBVar10;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_390);
        ppBVar20 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == ppBVar20) {
          local_3b0._16_8_ = *ppBVar20;
          local_3b0._24_8_ = plVar14[3];
          local_3b0._0_8_ = local_3b0 + 0x10;
        }
        else {
          local_3b0._16_8_ = *ppBVar20;
          local_3b0._0_8_ = (pointer)*plVar14;
        }
        local_3b0._8_8_ = plVar14[1];
        *plVar14 = (long)ppBVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_3b0._0_8_,local_3b0._8_8_);
        local_404 = local_88;
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
        }
        if ((BasicBlock *)local_390._0_8_ != (BasicBlock *)(local_390 + 0x10)) {
          operator_delete((void *)local_390._0_8_,(ulong)(local_390._16_8_ + 1));
        }
        if ((Instruction *)local_348._0_8_ != (Instruction *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
        }
        if ((BasicBlock *)local_370._0_8_ != (BasicBlock *)(local_370 + 0x10)) {
          operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (BasicBlock *)&local_2e8) {
          operator_delete(local_2f8,(long)local_2e8 + 1);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,(ulong)((long)&local_268->id_ + 1));
        }
        if ((Instruction **)local_298._M_w != &local_288) {
          operator_delete((void *)local_298._M_w,
                          (ulong)((long)&(local_288->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
        if ((BasicBlock *)local_3d0._0_8_ != (BasicBlock *)(local_3d0 + 0x10)) {
          operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3c0._1_7_,local_3c0[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
        }
        if (local_328 != (undefined1  [8])local_318) {
          operator_delete((void *)local_328,
                          CONCAT71(local_318[0]._M_allocated_capacity._1_7_,
                                   local_318[0]._M_local_buf[0]) + 1);
        }
        goto LAB_0061034c;
      }
LAB_0060fb72:
      pBVar10 = *(BasicBlock **)pBVar10;
    } while (pBVar10 != pBVar9);
  }
  local_404 = ValidateStructuredSelections
                        (_,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                            *)local_2d8);
LAB_0061034c:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_404;
LAB_0060f486:
  ppBVar20 = ppBVar20 + 1;
  if (ppBVar20 == ppBVar2) goto LAB_0060f48f;
  goto LAB_0060f458;
LAB_0060f84a:
  ppBVar20 = ppBVar20 + 1;
  if (ppBVar20 == ppBVar2) goto LAB_0060f853;
  goto LAB_0060f7df;
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          if (!pred->structurally_reachable()) {
            continue;
          }
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      if (auto error = StructuredSwitchChecks(_, function, construct)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}